

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O2

void Cbs_ManDeriveReason(Cbs_Man_t *p,int Level)

{
  Cbs_Que_t *p_00;
  Gia_Obj_t *pVar;
  Vec_Ptr_t *pVVar1;
  ulong *puVar2;
  int iVar3;
  void **ppvVar4;
  Gia_Obj_t **ppGVar5;
  long lVar6;
  char *__function;
  long lVar7;
  uint uVar8;
  int local_40;
  
  lVar7 = (long)(p->pClauses).iHead;
  if ((p->pClauses).pData[lVar7] != (Gia_Obj_t *)0x0) {
    __assert_fail("pQue->pData[pQue->iHead] == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                  ,0x250,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
  }
  lVar7 = lVar7 + 1;
  iVar3 = (p->pClauses).iTail;
  local_40 = (int)lVar7;
  if (iVar3 <= local_40) {
    __assert_fail("pQue->iHead + 1 < pQue->iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                  ,0x251,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
  }
  p->vTemp->nSize = 0;
  p_00 = &p->pClauses;
  do {
    ppGVar5 = (p->pClauses).pData;
    if (iVar3 <= lVar7) {
      if (ppGVar5[p_00->iHead] == (Gia_Obj_t *)0x0) {
        __assert_fail("pQue->pData[pQue->iHead] != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                      ,0x277,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
      }
      (p->pClauses).iTail = local_40;
      for (lVar7 = 0; lVar7 < p->vTemp->nSize; lVar7 = lVar7 + 1) {
        puVar2 = (ulong *)p->vTemp->pArray[lVar7];
        *puVar2 = *puVar2 | 0x40000000;
      }
      return;
    }
    pVar = ppGVar5[lVar7];
    if (((uint)*(ulong *)pVar >> 0x1e & 1) != 0) {
      *(ulong *)pVar = *(ulong *)pVar & 0xffffffffbfffffff;
      pVVar1 = p->vTemp;
      iVar3 = pVVar1->nSize;
      if (iVar3 == pVVar1->nCap) {
        uVar8 = iVar3 * 2;
        if (iVar3 < 0x10) {
          uVar8 = 0x10;
        }
        if (iVar3 < (int)uVar8) {
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar8 << 3);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar1->pArray,(ulong)uVar8 << 3);
            iVar3 = pVVar1->nSize;
          }
          pVVar1->pArray = ppvVar4;
          pVVar1->nCap = uVar8;
        }
      }
      pVVar1->nSize = iVar3 + 1;
      pVVar1->pArray[iVar3] = pVar;
      iVar3 = Cbs_VarDecLevel(p,pVar);
      if (iVar3 < Level) {
        ppGVar5 = (p->pClauses).pData;
        lVar6 = (long)local_40;
        local_40 = local_40 + 1;
      }
      else {
        if (iVar3 != Level) {
          __assert_fail("iLitLevel == Level",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                        ,0x26a,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
        }
        if (pVar->Value == 0xffffffff) {
          __function = "Gia_Obj_t *Cbs_VarReason0(Cbs_Man_t *, Gia_Obj_t *)";
          uVar8 = 100;
LAB_00549f15:
          __assert_fail("pVar->Value != ~0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                        ,uVar8,__function);
        }
        iVar3 = Vec_IntEntry(p->vLevReas,pVar->Value * 3 + 1);
        if (iVar3 != 0) {
          Cbs_QuePush(p_00,pVar + iVar3);
          if (pVar->Value == 0xffffffff) {
            __function = "Gia_Obj_t *Cbs_VarReason1(Cbs_Man_t *, Gia_Obj_t *)";
            uVar8 = 0x65;
            goto LAB_00549f15;
          }
          iVar3 = Vec_IntEntry(p->vLevReas,pVar->Value * 3 + 2);
          if (iVar3 != 0) {
            Cbs_QuePush(p_00,pVar + iVar3);
          }
          goto LAB_00549e6c;
        }
        ppGVar5 = (p->pClauses).pData;
        lVar6 = (long)(p->pClauses).iHead;
        if (ppGVar5[lVar6] != (Gia_Obj_t *)0x0) {
          __assert_fail("pQue->pData[pQue->iHead] == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                        ,0x26e,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
        }
      }
      ppGVar5[lVar6] = pVar;
    }
LAB_00549e6c:
    lVar7 = lVar7 + 1;
    iVar3 = (p->pClauses).iTail;
  } while( true );
}

Assistant:

static inline void Cbs_ManDeriveReason( Cbs_Man_t * p, int Level )
{
    Cbs_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pObj, * pReason;
    int i, k, iLitLevel;
    assert( pQue->pData[pQue->iHead] == NULL );
    assert( pQue->iHead + 1 < pQue->iTail );
/*
    for ( i = pQue->iHead + 1; i < pQue->iTail; i++ )
    {
        pObj = pQue->pData[i];
        assert( pObj->fMark0 == 1 );
    }
*/
    // compact literals
    Vec_PtrClear( p->vTemp );
    for ( i = k = pQue->iHead + 1; i < pQue->iTail; i++ )
    {
        pObj = pQue->pData[i];
        if ( !pObj->fMark0 ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fMark0 = 0;
        Vec_PtrPush( p->vTemp, pObj );
        // check decision level
        iLitLevel = Cbs_VarDecLevel( p, pObj );
        if ( iLitLevel < Level )
        {
            pQue->pData[k++] = pObj;
            continue;
        }
        assert( iLitLevel == Level );
        pReason = Cbs_VarReason0( p, pObj );
        if ( pReason == pObj ) // no reason
        {
            assert( pQue->pData[pQue->iHead] == NULL );
            pQue->pData[pQue->iHead] = pObj;
            continue;
        }
        Cbs_QuePush( pQue, pReason );
        pReason = Cbs_VarReason1( p, pObj );
        if ( pReason != pObj ) // second reason
            Cbs_QuePush( pQue, pReason );
    }
    assert( pQue->pData[pQue->iHead] != NULL );
    pQue->iTail = k;
    // clear the marks
    Vec_PtrForEachEntry( Gia_Obj_t *, p->vTemp, pObj, i )
        pObj->fMark0 = 1;
}